

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveAttachExpr(NameContext *pName,Expr *pExpr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Walker WStack_58;
  
  if (pExpr != (Expr *)0x0) {
    if (pExpr->op != ';') {
      if (pExpr == (Expr *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar1 = pName->ncFlags;
        pName->ncFlags = uVar1 & 0xf7ff6fef;
        WStack_58.pParse = pName->pParse;
        WStack_58.xExprCallback = resolveExprStep;
        WStack_58.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
        if ((uVar1 >> 0x13 & 1) == 0) {
          WStack_58.xSelectCallback = resolveSelectStep;
        }
        WStack_58.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
        iVar4 = (WStack_58.pParse)->nHeight + pExpr->nHeight;
        (WStack_58.pParse)->nHeight = iVar4;
        WStack_58.u.pNC = pName;
        iVar4 = sqlite3ExprCheckHeight(WStack_58.pParse,iVar4);
        uVar3 = 1;
        if (iVar4 == 0) {
          walkExpr(&WStack_58,pExpr);
          (WStack_58.pParse)->nHeight = (WStack_58.pParse)->nHeight - pExpr->nHeight;
          uVar2 = pName->ncFlags;
          pExpr->flags = pExpr->flags | uVar2 & 0x8010;
          pName->ncFlags = uVar1 & 0x8009010 | uVar2;
          if (pName->nNcErr < 1) {
            uVar3 = (uint)(0 < (WStack_58.pParse)->nErr);
          }
        }
      }
      return uVar3;
    }
    pExpr->op = 'u';
  }
  return 0;
}

Assistant:

static int resolveAttachExpr(NameContext *pName, Expr *pExpr)
{
  int rc = SQLITE_OK;
  if( pExpr ){
    if( pExpr->op!=TK_ID ){
      rc = sqlite3ResolveExprNames(pName, pExpr);
    }else{
      pExpr->op = TK_STRING;
    }
  }
  return rc;
}